

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

ssize_t __thiscall
OpenMesh::IO::_PLYReader_::read(_PLYReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint uVar2;
  mostream *pmVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar4;
  undefined4 in_register_00000034;
  istream *_in;
  
  _in = (istream *)CONCAT44(in_register_00000034,__fd);
  if (*(int *)(_in + *(long *)(*(long *)_in + -0x18) + 0x20) != 0) {
    pmVar3 = omerr();
    std::__ostream_insert<char,std::char_traits<char>>
              (&pmVar3->super_ostream,"[PLYReader] : cannot not use stream",0x23);
    std::ios::widen((char)(pmVar3->super_ostream)._vptr_basic_ostream[-3] + (char)pmVar3);
    std::ostream::put((char)pmVar3);
    std::ostream::flush();
    return 0;
  }
  (this->userOptions_).flags_ = *(value_type *)__nbytes;
  *(undefined4 *)__nbytes = 0;
  uVar4 = (this->options_).flags_;
  uVar2 = 0;
  if (((uVar4 & 0x10) != 0) && (((this->userOptions_).flags_ & 0x10) != 0)) {
    *(undefined4 *)__nbytes = 0x10;
    uVar4 = (this->options_).flags_;
    uVar2 = 0x10;
  }
  if (((uVar4 & 0x40) != 0) && (((this->userOptions_).flags_ & 0x40) != 0)) {
    uVar2 = uVar2 | 0x40;
    *(uint *)__nbytes = uVar2;
    uVar4 = (this->options_).flags_;
  }
  if (((uVar4 & 0x20) != 0) && (((this->userOptions_).flags_ & 0x20) != 0)) {
    uVar2 = uVar2 | 0x20;
    *(uint *)__nbytes = uVar2;
    uVar4 = (this->options_).flags_;
  }
  if (((uVar4 >> 9 & 1) != 0) && (((this->userOptions_).flags_ & 0x200) != 0)) {
    uVar2 = uVar2 | 0x200;
    *(uint *)__nbytes = uVar2;
    uVar4 = (this->options_).flags_;
  }
  if ((uVar4 & 1) != 0) {
    uVar2 = uVar2 | 1;
    *(uint *)__nbytes = uVar2;
    uVar4 = (this->options_).flags_;
  }
  if ((uVar4 >> 0xc & 1) != 0) {
    uVar2 = uVar2 | 0x1000;
    *(uint *)__nbytes = uVar2;
    uVar4 = (this->options_).flags_;
  }
  if (((uVar4 >> 0xd & 1) != 0) && (((this->userOptions_).flags_ & 0x2000) != 0)) {
    *(uint *)__nbytes = uVar2 | 0x2000;
    uVar4 = (this->options_).flags_;
  }
  if ((uVar4 & 1) == 0) {
    bVar1 = read_ascii(this,_in,(BaseImporter *)__buf,(Options *)__nbytes);
    return CONCAT71(extraout_var,bVar1);
  }
  bVar1 = read_binary(this,_in,(BaseImporter *)__buf,false,(Options *)__nbytes);
  return CONCAT71(extraout_var_00,bVar1);
}

Assistant:

bool _PLYReader_::read(std::istream& _in, BaseImporter& _bi, Options& _opt) {

    if (!_in.good()) {
        omerr() << "[PLYReader] : cannot not use stream" << std::endl;
        return false;
    }

    // filter relevant options for reading
    bool swap = _opt.check(Options::Swap);

    userOptions_ = _opt;

    // build options to be returned
    _opt.clear();

    if (options_.vertex_has_normal() && userOptions_.vertex_has_normal()) {
        _opt += Options::VertexNormal;
    }
    if (options_.vertex_has_texcoord() && userOptions_.vertex_has_texcoord()) {
        _opt += Options::VertexTexCoord;
    }
    if (options_.vertex_has_color() && userOptions_.vertex_has_color()) {
        _opt += Options::VertexColor;
    }
    if (options_.face_has_color() && userOptions_.face_has_color()) {
        _opt += Options::FaceColor;
    }
    if (options_.is_binary()) {
        _opt += Options::Binary;
    }
    if (options_.color_is_float()) {
        _opt += Options::ColorFloat;
    }
    if (options_.check(Options::Custom) && userOptions_.check(Options::Custom)) {
        _opt += Options::Custom;
    }

    //    //force user-choice for the alpha value when reading binary
    //    if ( options_.is_binary() && userOptions_.color_has_alpha() )
    //      options_ += Options::ColorAlpha;

    return (options_.is_binary() ? read_binary(_in, _bi, swap, _opt) : read_ascii(_in, _bi, _opt));

}